

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

int mcpl_rewind(mcpl_file_t ff)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  lVar1 = *(long *)((long)ff.internal + 0x40);
  lVar2 = *(long *)((long)ff.internal + 0x88);
  *(undefined8 *)((long)ff.internal + 0x88) = 0;
  if ((lVar1 != 0) && (lVar2 != 0)) {
    if (*(long *)((long)ff.internal + 8) == 0) {
      iVar3 = fseek(*ff.internal,*(long *)((long)ff.internal + 0x80),0);
      bVar5 = iVar3 == 0;
    }
    else {
      lVar2 = *(long *)((long)ff.internal + 0x80);
      lVar4 = gzseek64(*(long *)((long)ff.internal + 8),lVar2,0);
      bVar5 = lVar4 == lVar2;
    }
    if (!bVar5) {
      (*mcpl_error_handler)("Errors encountered while rewinding particle list");
      printf("MCPL ERROR: %s\n",
             "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
            );
      exit(1);
    }
  }
  return (int)(lVar1 != 0);
}

Assistant:

int mcpl_rewind(mcpl_file_t ff)
{
  MCPLIMP_FILEDECODE;
  int already_there = (f->current_particle_idx==0);
  f->current_particle_idx = 0;
  int notEOF = f->current_particle_idx<f->nparticles;
  if (notEOF&&!already_there) {
    int error;
    if (f->filegz) {
      error = ! mcpl_gzseek( f->filegz, f->first_particle_pos );
    } else {
      error = MCPL_FSEEK( f->file, f->first_particle_pos )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while rewinding particle list");
  }
  return notEOF;
}